

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise::forward
          (ConvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  uint uVar2;
  Allocator *pAVar3;
  Layer *pLVar4;
  void *pvVar5;
  size_t sVar6;
  size_t sVar7;
  void *pvVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  Allocator *pAVar12;
  pointer piVar13;
  undefined1 auVar14 [16];
  int k;
  uint uVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  void *pvVar21;
  ulong uVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int *piVar27;
  int iVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  int iVar32;
  size_type __n;
  void *pvVar33;
  int iVar34;
  char *pcVar35;
  long lVar36;
  void *pvVar37;
  ulong uVar38;
  long lVar39;
  bool bVar40;
  float fVar41;
  void *local_200;
  long local_1f8;
  ulong local_1d8;
  void *local_1d0;
  undefined1 local_1c8 [16];
  Allocator *local_1b8;
  Allocator *pAStack_1b0;
  int local_1a8;
  int iStack_1a4;
  int iStack_1a0;
  uint uStack_19c;
  ulong local_198;
  ulong local_190;
  char *local_188;
  ulong local_180;
  Option *local_178;
  char *weight_data_ptr;
  ulong local_168;
  char *local_160;
  char *local_158;
  Mat top_blob_g;
  Option opt_g_2;
  Mat local_a0;
  vector<int,_std::allocator<int>_> _space_ofs;
  Option opt_g_1;
  
  uVar1 = bottom_blob->c;
  if ((int)uVar1 % this->group != 0) {
    return -100;
  }
  if (this->num_output % this->group != 0) {
    return -100;
  }
  iVar24 = bottom_blob->w;
  iVar34 = bottom_blob->h;
  pAVar3 = (Allocator *)bottom_blob->elemsize;
  uVar23 = (this->kernel_w + -1) * this->dilation_w;
  uVar15 = (this->kernel_h + -1) * this->dilation_h;
  local_a0.data = bottom_blob->data;
  local_a0.refcount = bottom_blob->refcount;
  local_a0.allocator = bottom_blob->allocator;
  local_a0.dims = bottom_blob->dims;
  local_a0.w = iVar24;
  local_a0.c = uVar1;
  local_a0.h = iVar34;
  if (local_a0.refcount != (int *)0x0) {
    LOCK();
    *local_a0.refcount = *local_a0.refcount + 1;
    UNLOCK();
    local_a0.w = bottom_blob->w;
    local_a0.h = bottom_blob->h;
    local_a0.c = bottom_blob->c;
  }
  local_a0.cstep = bottom_blob->cstep;
  local_178 = opt;
  local_a0.elemsize = (size_t)pAVar3;
  if ((pAVar3 != (Allocator *)0x1 & this->use_int8_inference) == 1) {
    pAStack_1b0 = opt->workspace_allocator;
    local_1c8 = (undefined1  [16])0x0;
    local_1b8 = (Allocator *)0x1;
    local_1a8 = 3;
    uStack_19c = uVar1;
    iStack_1a0 = iVar34;
    local_198 = (long)(iVar34 * iVar24) + 0xfU & 0xfffffffffffffff0;
    uVar30 = local_198 * (long)(int)uVar1;
    iStack_1a4 = iVar24;
    if (uVar30 == 0) {
      iVar34 = -100;
      goto LAB_001396c8;
    }
    if (pAStack_1b0 == (Allocator *)0x0) {
      pvVar21 = malloc(uVar30 + 0x1c);
      local_1c8._0_8_ = (long)pvVar21 + 0x17U & 0xfffffffffffffff0;
      *(void **)(local_1c8._0_8_ - 8) = pvVar21;
    }
    else {
      local_1c8._0_8_ = (*(code *)**(undefined8 **)pAStack_1b0)(pAStack_1b0,uVar30 | 4);
    }
    local_1c8._8_8_ = (int *)(local_1c8._0_8_ + uVar30);
    *(undefined4 *)(local_1c8._0_8_ + uVar30) = 1;
    iVar16 = (int)uVar1 / this->group;
    piVar27 = (int *)(local_1c8._0_8_ + uVar30);
    if (this->group < 1) {
LAB_00138739:
      LOCK();
      *piVar27 = *piVar27 + 1;
      UNLOCK();
    }
    else {
      lVar39 = 0;
      lVar36 = 0;
      do {
        pAVar12 = pAStack_1b0;
        uVar9._0_1_ = local_178->lightmode;
        uVar9._1_3_ = *(undefined3 *)&local_178->field_0x1;
        uVar9._4_4_ = local_178->num_threads;
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)local_178->workspace_allocator;
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)CONCAT44(1,(int)uVar9);
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)pAStack_1b0;
        top_blob_g.w = bottom_blob->w;
        top_blob_g.h = bottom_blob->h;
        top_blob_g.elemsize = bottom_blob->elemsize;
        top_blob_g.data =
             (void *)(bottom_blob->cstep * lVar39 * top_blob_g.elemsize + (long)bottom_blob->data);
        top_blob_g.allocator = bottom_blob->allocator;
        top_blob_g.refcount = (int *)0x0;
        top_blob_g.dims = 3;
        top_blob_g.cstep =
             ((long)(top_blob_g.h * top_blob_g.w) * top_blob_g.elemsize + 0xf & 0xfffffffffffffff0)
             / top_blob_g.elemsize;
        opt_g_2._0_8_ = local_198 * lVar39 * (long)local_1b8 + local_1c8._0_8_;
        opt_g_2.blob_allocator = (Allocator *)0x0;
        opt_g_2.workspace_allocator = local_1b8;
        pLVar4 = (this->quantize_ops).
                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar36];
        top_blob_g.c = iVar16;
        (*pLVar4->_vptr_Layer[5])(pLVar4,&top_blob_g,&opt_g_2,&_space_ofs);
        if (opt_g_2.blob_allocator != (Allocator *)0x0) {
          LOCK();
          *(int *)opt_g_2.blob_allocator = *(int *)opt_g_2.blob_allocator + -1;
          UNLOCK();
          if (*(int *)opt_g_2.blob_allocator == 0) {
            if (pAVar12 == (Allocator *)0x0) {
              if (opt_g_2._0_8_ != 0) {
                free(*(void **)(opt_g_2._0_8_ + -8));
              }
            }
            else {
              (**(code **)(*(long *)pAVar12 + 8))();
            }
          }
        }
        if (top_blob_g.refcount != (int *)0x0) {
          LOCK();
          *top_blob_g.refcount = *top_blob_g.refcount + -1;
          UNLOCK();
          if (*top_blob_g.refcount == 0) {
            if (top_blob_g.allocator == (Allocator *)0x0) {
              if (top_blob_g.data != (void *)0x0) {
                free(*(void **)((long)top_blob_g.data + -8));
              }
            }
            else {
              (**(code **)(*(long *)top_blob_g.allocator + 8))();
            }
          }
        }
        lVar36 = lVar36 + 1;
        lVar39 = lVar39 + iVar16;
      } while (lVar36 < this->group);
      piVar27 = (int *)local_1c8._8_8_;
      opt = local_178;
      if ((int *)local_1c8._8_8_ != (int *)0x0) goto LAB_00138739;
    }
    if (local_a0.refcount != (int *)0x0) {
      LOCK();
      *local_a0.refcount = *local_a0.refcount + -1;
      UNLOCK();
      if (*local_a0.refcount == 0) {
        if (local_a0.allocator == (Allocator *)0x0) {
          if (local_a0.data != (void *)0x0) {
            free(*(void **)((long)local_a0.data + -8));
          }
        }
        else {
          (**(code **)(*(long *)local_a0.allocator + 8))();
        }
      }
    }
    local_a0.data = (void *)local_1c8._0_8_;
    local_a0.refcount = (int *)local_1c8._8_8_;
    local_a0.elemsize = (size_t)local_1b8;
    local_a0.allocator = pAStack_1b0;
    local_a0.w = iStack_1a4;
    local_a0.dims = local_1a8;
    local_a0.h = iStack_1a0;
    local_a0.c = uStack_19c;
    local_a0.cstep = local_198;
    if ((int *)local_1c8._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_1c8._8_8_ = *(int *)local_1c8._8_8_ + -1;
      UNLOCK();
      if (*(int *)local_1c8._8_8_ == 0) {
        if (pAStack_1b0 == (Allocator *)0x0) {
          if ((void *)local_1c8._0_8_ != (void *)0x0) {
            free(*(void **)(local_1c8._0_8_ + -8));
          }
        }
        else {
          (**(code **)(*(long *)pAStack_1b0 + 8))();
        }
      }
    }
  }
  auVar14 = (undefined1  [16])local_a0._32_16_;
  local_1c8._8_8_ = local_a0.refcount;
  local_1c8._0_8_ = local_a0.data;
  local_1b8 = (Allocator *)local_a0.elemsize;
  pAStack_1b0 = local_a0.allocator;
  local_1a8 = local_a0.dims;
  if (local_a0.refcount != (int *)0x0) {
    LOCK();
    *local_a0.refcount = *local_a0.refcount + 1;
    UNLOCK();
  }
  iStack_1a4 = local_a0.w;
  iStack_1a0 = local_a0.h;
  uStack_19c = local_a0.c;
  local_198 = local_a0.cstep;
  iVar16 = this->pad_w;
  iVar26 = this->pad_h;
  local_a0._32_16_ = auVar14;
  if (iVar26 < 1 && iVar16 < 1) {
    if (iVar26 == -0xe9 && iVar16 == -0xe9) {
      iVar16 = uVar23 - (iVar24 + -1) % this->stride_w;
      iVar24 = uVar15 - (iVar34 + -1) % this->stride_h;
      if ((0 < iVar16) || (0 < iVar24)) {
        copy_make_border(&local_a0,(Mat *)local_1c8,iVar24 / 2,iVar24 - iVar24 / 2,iVar16 / 2,
                         iVar16 - iVar16 / 2,0,0.0,opt->workspace_allocator,opt->num_threads);
        goto LAB_001388cb;
      }
      iVar34 = auVar14._8_4_;
      iVar24 = local_a0.w;
    }
LAB_00138968:
    local_a0._32_16_ = auVar14;
    iVar16 = (int)(~uVar23 + iVar24) / this->stride_w;
    uVar23 = iVar16 + 1;
    uVar30 = (long)(int)(~uVar15 + iVar34) / (long)this->stride_h;
    local_180 = uVar30 & 0xffffffff;
    uVar15 = (int)uVar30 + 1;
    Mat::create(top_blob,uVar23,uVar15,this->num_output,(size_t)pAVar3,opt->blob_allocator);
    iVar34 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar30 = (ulong)uVar23;
      uVar17 = this->kernel_w * this->kernel_h;
      __n = (size_type)(int)uVar17;
      std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,__n,(allocator_type *)&top_blob_g);
      piVar13 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar34 = this->kernel_h;
      if (0 < iVar34) {
        iVar26 = this->dilation_h;
        iVar32 = this->kernel_w;
        iVar18 = this->dilation_w * iVar32;
        iVar19 = 0;
        iVar25 = 0;
        iVar28 = 0;
        do {
          if (0 < iVar32) {
            lVar36 = 0;
            do {
              _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar19 + lVar36] = iVar25;
              iVar25 = iVar25 + this->dilation_w;
              iVar32 = this->kernel_w;
              lVar36 = lVar36 + 1;
            } while ((int)lVar36 < iVar32);
            iVar19 = iVar19 + (int)lVar36;
            iVar34 = this->kernel_h;
          }
          iVar25 = iVar25 + (iVar24 * iVar26 - iVar18);
          iVar28 = iVar28 + 1;
        } while (iVar28 < iVar34);
      }
      uVar20 = this->num_output;
      uVar2 = this->group;
      uVar31 = (ulong)uVar2;
      if (this->use_int8_inference == false) {
        if (uVar20 != uVar2 || uVar1 != uVar2) {
          iVar24 = (int)((long)(int)uVar1 / (long)(int)uVar2);
          if (0 < (int)uVar2) {
            weight_data_ptr = (char *)((long)(int)uVar20 / (long)(int)uVar2 & 0xffffffff);
            pvVar21 = top_blob->data;
            local_178 = (Option *)(top_blob->cstep * top_blob->elemsize);
            pvVar5 = (this->weight_data).data;
            local_168 = (ulong)(int)uVar23;
            iVar26 = (int)((long)(int)uVar20 / (long)(int)uVar2);
            iVar34 = 0;
            local_190 = 0;
            do {
              if (0 < iVar26) {
                local_1d0 = (void *)((long)pvVar5 + (long)iVar34 * 4);
                local_188 = (char *)0x0;
                do {
                  if (-1 < (int)local_180) {
                    local_160 = local_188 + local_190 * (long)iVar26;
                    pvVar33 = (void *)((long)local_178 * (long)local_160 + (long)pvVar21);
                    iVar32 = this->bias_term;
                    iVar18 = 0;
                    do {
                      if (-1 < iVar16) {
                        pvVar8 = (this->bias_data).data;
                        iVar19 = this->stride_h;
                        local_158 = (char *)(long)this->stride_w;
                        uVar29 = 0;
                        do {
                          if (iVar32 == 0) {
                            fVar41 = 0.0;
                          }
                          else {
                            fVar41 = *(float *)((long)pvVar8 + (long)local_160 * 4);
                          }
                          if (0 < iVar24) {
                            uVar38 = 0;
                            pvVar37 = local_1d0;
                            do {
                              if (0 < (int)uVar17) {
                                uVar22 = 0;
                                do {
                                  fVar41 = fVar41 + *(float *)((long)pvVar37 + uVar22 * 4) *
                                                    *(float *)(local_1c8._0_8_ +
                                                              (long)_space_ofs.
                                                                                                                                        
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar22] *
                                                  4 + (uVar38 + (uint)(iVar24 * (int)local_190)) *
                                                      local_198 * (long)local_1b8 +
                                                      uVar29 * (long)local_158 * 4 +
                                                      (long)(iStack_1a4 * iVar18 * iVar19) * 4);
                                  uVar22 = uVar22 + 1;
                                } while (uVar17 != uVar22);
                              }
                              uVar38 = uVar38 + 1;
                              pvVar37 = (void *)((long)pvVar37 + __n * 4);
                            } while (uVar38 != ((long)(int)uVar1 / (long)(int)uVar2 & 0xffffffffU));
                          }
                          *(float *)((long)pvVar33 + uVar29 * 4) = fVar41;
                          uVar29 = uVar29 + 1;
                        } while (uVar29 != uVar30);
                      }
                      pvVar33 = (void *)((long)pvVar33 + local_168 * 4);
                      bVar40 = iVar18 != (int)local_180;
                      iVar18 = iVar18 + 1;
                    } while (bVar40);
                  }
                  local_188 = local_188 + 1;
                  local_1d0 = (void *)((long)local_1d0 + (long)(int)(iVar24 * uVar17) * 4);
                } while (local_188 != weight_data_ptr);
              }
              local_190 = local_190 + 1;
              iVar34 = iVar34 + iVar26 * iVar24 * uVar17;
            } while (local_190 != uVar31);
          }
        }
        else if (0 < (int)uVar1) {
          local_160 = (char *)top_blob->data;
          sVar6 = top_blob->cstep;
          sVar7 = top_blob->elemsize;
          pvVar21 = (this->weight_data).data;
          local_168 = CONCAT44(local_168._4_4_,iStack_1a4);
          local_188 = (char *)local_1c8._0_8_;
          weight_data_ptr = (char *)(local_198 * (long)local_1b8);
          uVar31 = 0;
          do {
            if (-1 < (int)local_180) {
              pcVar35 = local_160 + sVar6 * sVar7 * uVar31;
              iVar24 = this->bias_term;
              iVar26 = this->stride_h * iStack_1a4;
              local_158 = (char *)CONCAT44(local_158._4_4_,iVar26);
              iVar34 = this->stride_w;
              local_200 = (void *)0x0;
              do {
                if (-1 < iVar16) {
                  pvVar5 = (this->bias_data).data;
                  uVar29 = 0;
                  do {
                    if (iVar24 == 0) {
                      fVar41 = 0.0;
                    }
                    else {
                      fVar41 = *(float *)((long)pvVar5 + uVar31 * 4);
                    }
                    if (0 < (int)uVar17) {
                      uVar38 = 0;
                      do {
                        fVar41 = fVar41 + *(float *)((long)pvVar21 + uVar38 * 4) *
                                          *(float *)(local_1c8._0_8_ +
                                                    (long)_space_ofs.
                                                                                                                    
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar38] *
                                                  4 + uVar29 * (long)iVar34 * 4 +
                                                      (long)(iVar26 * (int)local_200) * 4 +
                                                      (long)weight_data_ptr * uVar31);
                        uVar38 = uVar38 + 1;
                      } while (uVar17 != uVar38);
                    }
                    *(float *)(pcVar35 + uVar29 * 4) = fVar41;
                    uVar29 = uVar29 + 1;
                  } while (uVar29 != uVar30);
                }
                pcVar35 = pcVar35 + (long)(int)uVar23 * 4;
                local_200 = (void *)((long)local_200 + 1);
              } while (local_200 != (void *)(ulong)uVar15);
            }
            uVar31 = uVar31 + 1;
            pvVar21 = (void *)((long)pvVar21 + __n * 4);
          } while (uVar31 != uVar1);
        }
      }
      else if (uVar20 != uVar2 || uVar1 != uVar2) {
        uVar20 = (int)uVar20 / (int)uVar2;
        local_190 = CONCAT44(local_190._4_4_,uVar20);
        if (0 < (int)uVar2) {
          pvVar21 = top_blob->data;
          sVar6 = top_blob->cstep;
          sVar7 = top_blob->elemsize;
          pvVar5 = (this->weight_data).data;
          iVar24 = (int)((long)(int)uVar1 / (long)(int)uVar2);
          local_160 = (char *)(long)(int)uVar23;
          local_168 = (ulong)uVar20;
          lVar36 = 0;
          do {
            if (0 < (int)uVar20) {
              local_188 = (char *)(lVar36 * (int)uVar20);
              weight_data_ptr =
                   (char *)((long)(int)(uVar20 * iVar24 * uVar17 * (int)lVar36) + (long)pvVar5);
              local_1d8 = 0;
              do {
                if (-1 < (int)local_180) {
                  local_200 = (void *)((long)(local_188 + local_1d8) * sVar6 * sVar7 + (long)pvVar21
                                      );
                  iVar34 = 0;
                  do {
                    if (-1 < iVar16) {
                      local_158 = (char *)local_1c8._0_8_;
                      uVar31 = 0;
                      do {
                        if (iVar24 < 1) {
                          iVar26 = 0;
                        }
                        else {
                          uVar29 = 0;
                          iVar26 = 0;
                          pcVar35 = weight_data_ptr + local_1d8 * (long)(int)(iVar24 * uVar17);
                          do {
                            if (0 < (int)uVar17) {
                              uVar38 = 0;
                              do {
                                iVar26 = iVar26 + (int)pcVar35[uVar38] *
                                                  (int)*(char *)(local_1c8._0_8_ +
                                                                (long)_space_ofs.
                                                                                                                                            
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar38] +
                                                  (uVar29 + (uint)(iVar24 * (int)lVar36)) *
                                                  local_198 * (long)local_1b8 +
                                                  (long)(iStack_1a4 * iVar34 * this->stride_h) +
                                                  (long)(int)uVar31 * (long)this->stride_w);
                                uVar38 = uVar38 + 1;
                              } while (uVar17 != uVar38);
                            }
                            pcVar35 = pcVar35 + __n;
                            uVar29 = uVar29 + 1;
                          } while (uVar29 != ((long)(int)uVar1 / (long)(int)uVar2 & 0xffffffffU));
                        }
                        *(int *)((long)local_200 + uVar31 * 4) = iVar26;
                        uVar31 = uVar31 + 1;
                      } while (uVar31 != uVar30);
                    }
                    local_200 = (void *)((long)local_200 + (long)local_160 * 4);
                    bVar40 = iVar34 != (int)local_180;
                    iVar34 = iVar34 + 1;
                  } while (bVar40);
                }
                local_1d8 = local_1d8 + 1;
              } while (local_1d8 != local_168);
              uVar31 = (ulong)(uint)this->group;
            }
            lVar36 = lVar36 + 1;
          } while (lVar36 < (int)uVar31);
          if (0 < (int)uVar31) {
            lVar36 = 0;
            lVar39 = 0;
            do {
              uVar11._0_1_ = local_178->lightmode;
              uVar11._1_3_ = *(undefined3 *)&local_178->field_0x1;
              uVar11._4_4_ = local_178->num_threads;
              opt_g_2.workspace_allocator = local_178->workspace_allocator;
              opt_g_2._0_4_ = SUB84(uVar11,0);
              opt_g_2.num_threads = 1;
              top_blob_g.allocator = top_blob->allocator;
              top_blob_g.w = top_blob->w;
              top_blob_g.h = top_blob->h;
              top_blob_g.elemsize = top_blob->elemsize;
              top_blob_g.data =
                   (void *)(top_blob->cstep * lVar36 * top_blob_g.elemsize + (long)top_blob->data);
              top_blob_g.refcount = (int *)0x0;
              top_blob_g.dims = 3;
              top_blob_g.c = (int)local_190;
              top_blob_g.cstep =
                   ((long)(top_blob_g.h * top_blob_g.w) * top_blob_g.elemsize + 0xf &
                   0xfffffffffffffff0) / top_blob_g.elemsize;
              pLVar4 = (this->dequantize_ops).
                       super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar39];
              opt_g_2.blob_allocator = top_blob_g.allocator;
              (*pLVar4->_vptr_Layer[7])(pLVar4,&top_blob_g,&opt_g_2);
              Mat::~Mat(&top_blob_g);
              lVar39 = lVar39 + 1;
              lVar36 = lVar36 + (int)uVar20;
            } while (lVar39 < this->group);
          }
        }
      }
      else if (0 < (int)uVar1) {
        local_1f8 = 0;
        lVar36 = 0;
        do {
          pvVar21 = top_blob->data;
          opt_g_2.workspace_allocator = (Allocator *)top_blob->elemsize;
          lVar39 = top_blob->cstep * lVar36 * (long)opt_g_2.workspace_allocator;
          top_blob_g.data = (void *)(local_198 * lVar36 * (long)local_1b8 + local_1c8._0_8_);
          pvVar5 = (this->weight_data).data;
          top_blob_g.refcount = (int *)0x0;
          top_blob_g.elemsize = (size_t)local_1b8;
          top_blob_g.allocator = pAStack_1b0;
          top_blob_g.dims = 2;
          top_blob_g.w = iStack_1a4;
          top_blob_g.h = iStack_1a0;
          top_blob_g.c = 1;
          top_blob_g.cstep = (size_t)(iStack_1a0 * iStack_1a4);
          if (-1 < (int)local_180) {
            pvVar21 = (void *)((long)pvVar21 + lVar39);
            iVar24 = 0;
            do {
              if (-1 < iVar16) {
                uVar30 = 0;
                do {
                  if ((int)uVar17 < 1) {
                    iVar34 = 0;
                  }
                  else {
                    uVar31 = 0;
                    iVar34 = 0;
                    do {
                      iVar34 = iVar34 + (int)*(char *)((long)pvVar5 + uVar31 + local_1f8) *
                                        (int)*(char *)((long)top_blob_g.data +
                                                      (long)piVar13[uVar31] +
                                                      (long)(this->stride_h * iVar24 * iStack_1a4) +
                                                      (long)(int)uVar30 * (long)this->stride_w);
                      uVar31 = uVar31 + 1;
                    } while (uVar17 != uVar31);
                  }
                  *(int *)((long)pvVar21 + uVar30 * 4) = iVar34;
                  uVar30 = uVar30 + 1;
                } while (uVar30 != uVar23);
              }
              pvVar21 = (void *)((long)pvVar21 + (long)(int)uVar23 * 4);
              bVar40 = iVar24 != (int)local_180;
              iVar24 = iVar24 + 1;
            } while (bVar40);
            pvVar21 = top_blob->data;
            opt_g_2.workspace_allocator = (Allocator *)top_blob->elemsize;
            lVar39 = top_blob->cstep * lVar36 * (long)opt_g_2.workspace_allocator;
          }
          opt_g_2._0_8_ = lVar39 + (long)pvVar21;
          uVar10._0_1_ = local_178->lightmode;
          uVar10._1_3_ = *(undefined3 *)&local_178->field_0x1;
          uVar10._4_4_ = local_178->num_threads;
          opt_g_1.workspace_allocator = local_178->workspace_allocator;
          opt_g_1._0_4_ = SUB84(uVar10,0);
          opt_g_1.num_threads = 1;
          pAVar3 = top_blob->allocator;
          opt_g_2.blob_allocator = (Allocator *)0x0;
          pLVar4 = (this->dequantize_ops).
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar36];
          opt_g_1.blob_allocator = pAVar3;
          (*pLVar4->_vptr_Layer[7])(pLVar4,&opt_g_2,&opt_g_1);
          if (opt_g_2.blob_allocator != (Allocator *)0x0) {
            LOCK();
            *(int *)opt_g_2.blob_allocator = *(int *)opt_g_2.blob_allocator + -1;
            UNLOCK();
            if (*(int *)opt_g_2.blob_allocator == 0) {
              if (pAVar3 == (Allocator *)0x0) {
                if (opt_g_2._0_8_ != 0) {
                  free(*(void **)(opt_g_2._0_8_ + -8));
                }
              }
              else {
                (**(code **)(*(long *)pAVar3 + 8))();
              }
            }
          }
          if (top_blob_g.refcount != (int *)0x0) {
            LOCK();
            *top_blob_g.refcount = *top_blob_g.refcount + -1;
            UNLOCK();
            if (*top_blob_g.refcount == 0) {
              if (top_blob_g.allocator == (Allocator *)0x0) {
                if (top_blob_g.data != (void *)0x0) {
                  free(*(void **)((long)top_blob_g.data + -8));
                }
              }
              else {
                (**(code **)(*(long *)top_blob_g.allocator + 8))();
              }
            }
          }
          lVar36 = lVar36 + 1;
          local_1f8 = local_1f8 + __n;
        } while (lVar36 < this->group);
      }
      if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      iVar34 = 0;
    }
  }
  else {
    copy_make_border(&local_a0,(Mat *)local_1c8,iVar26,iVar26,iVar16,iVar16,0,0.0,
                     opt->workspace_allocator,opt->num_threads);
LAB_001388cb:
    iVar34 = -100;
    if (((void *)local_1c8._0_8_ != (void *)0x0) && ((long)(int)uStack_19c * local_198 != 0)) {
      iVar24 = iStack_1a4;
      iVar34 = iStack_1a0;
      auVar14 = (undefined1  [16])local_a0._32_16_;
      goto LAB_00138968;
    }
  }
  if ((int *)local_1c8._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_1c8._8_8_ = *(int *)local_1c8._8_8_ + -1;
    UNLOCK();
    if (*(int *)local_1c8._8_8_ == 0) {
      if (pAStack_1b0 == (Allocator *)0x0) {
        if ((void *)local_1c8._0_8_ != (void *)0x0) {
          free(*(void **)(local_1c8._0_8_ + -8));
        }
      }
      else {
        (**(code **)(*(long *)pAStack_1b0 + 8))();
      }
    }
  }
LAB_001396c8:
  if (local_a0.refcount != (int *)0x0) {
    LOCK();
    *local_a0.refcount = *local_a0.refcount + -1;
    UNLOCK();
    if (*local_a0.refcount == 0) {
      if (local_a0.allocator == (Allocator *)0x0) {
        if (local_a0.data != (void *)0x0) {
          free(*(void **)((long)local_a0.data + -8));
        }
      }
      else {
        (**(code **)(*(long *)local_a0.allocator + 8))();
      }
    }
  }
  return iVar34;
}

Assistant:

int ConvolutionDepthWise::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

//     fprintf(stderr, "ConvolutionDepthWise input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (use_int8_inference && elemsize != 1)
    {
        Mat bottom_blob_int8;
        bottom_blob_int8.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
        if (bottom_blob_int8.empty())
            return -100;

        const int channels_g = channels / group;

        // quantize, scale and round to nearest
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            ncnn::Option opt_g = opt;
            opt_g.num_threads = 1;
            opt_g.blob_allocator = bottom_blob_int8.allocator;

            const Mat bottom_blob_g = bottom_blob.channel_range(channels_g * g, channels_g);
            Mat bottom_blob_int8_g = bottom_blob_int8.channel_range(channels_g * g, channels_g);
            quantize_ops[g]->forward(bottom_blob_g, bottom_blob_int8_g, opt_g);
        }

        bottom_blob_unbordered = bottom_blob_int8;
    }

    Mat bottom_blob_bordered = bottom_blob_unbordered;
    if (pad_w > 0 || pad_h > 0)
    {
        copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, pad_h, pad_h, pad_w, pad_w, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_w == -233 && pad_h == -233)
    {
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    if (use_int8_inference)
    {
        // depth-wise
        if (channels == group && group == num_output)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int g=0; g<group; g++)
            {
                int* outptr = top_blob.channel(g);
                const signed char* kptr = (const signed char*)weight_data + maxk * g;
                const Mat m = bottom_blob_bordered.channel(g);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        int sum = 0;

                        const signed char* sptr = m.row<signed char>(i*stride_h) + j*stride_w;

                        for (int k = 0; k < maxk; k++)
                        {
                            signed char val = sptr[ space_ofs[k] ];
                            signed char w = kptr[k];
                            sum += val * w;
                        }

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }

                // dequantize, reverse scale inplace
                {
                    ncnn::Option opt_g = opt;
                    opt_g.num_threads = 1;
                    opt_g.blob_allocator = top_blob.allocator;

                    Mat top_blob_g = top_blob.channel_range(g, 1);
                    dequantize_ops[g]->forward_inplace(top_blob_g, opt_g);
                }
            }
        }
        else
        {
            const int channels_g = channels / group;
            const int num_output_g = num_output / group;

#ifdef _WIN32
            #pragma omp parallel for num_threads(opt.num_threads)
#else // _WIN32
            #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif // _WIN32
            for (int g=0; g<group; g++)
            {
                for (int p=0; p<num_output_g; p++)
                {
                    int* outptr = top_blob.channel(g * num_output_g + p);
                    const signed char* weight_data_ptr = (const signed char*)weight_data + maxk * channels_g * num_output_g * g;

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            int sum = 0;

                            const signed char* kptr = weight_data_ptr + maxk * channels_g * p;

                            // channels_g
                            for (int q=0; q<channels_g; q++)
                            {
                                const Mat m = bottom_blob_bordered.channel(channels_g * g + q);
                                const signed char* sptr = m.row<signed char>(i*stride_h) + j*stride_w;

                                for (int k = 0; k < maxk; k++)
                                {
                                    signed char val = sptr[ space_ofs[k] ];
                                    signed char w = kptr[k];
                                    sum += val * w;
                                }

                                kptr += maxk;
                            }

                            outptr[j] = sum;
                        }

                        outptr += outw;
                    }
                }
            }

            // dequantize, reverse scale inplace
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int g=0; g<group; g++)
            {
                ncnn::Option opt_g = opt;
                opt_g.num_threads = 1;
                opt_g.blob_allocator = top_blob.allocator;

                Mat top_blob_g = top_blob.channel_range(num_output_g * g, num_output_g);
                dequantize_ops[g]->forward_inplace(top_blob_g, opt_g);
            }
        }

        return 0;
    }

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            float* outptr = top_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            const Mat m = bottom_blob_bordered.channel(g);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                        sum = bias_data[g];

                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        float w = kptr[k];
                        sum += val * w;
                    }

                    outptr[j] = sum;
                }

                outptr += outw;
            }
        }

        return 0;
    }

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

#ifdef _WIN32
    #pragma omp parallel for num_threads(opt.num_threads)
#else // _WIN32
    #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif // _WIN32
    for (int g=0; g<group; g++)
    {
        for (int p=0; p<num_output_g; p++)
        {
            float* outptr = top_blob.channel(g * num_output_g + p);
            const float* weight_data_ptr = (const float*)weight_data + maxk * channels_g * num_output_g * g;

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                        sum = bias_data[num_output_g * g + p];

                    const float* kptr = weight_data_ptr + maxk * channels_g * p;

                    // channels_g
                    for (int q=0; q<channels_g; q++)
                    {
                        const Mat m = bottom_blob_bordered.channel(channels_g * g + q);
                        const float* sptr = m.row(i*stride_h) + j*stride_w;

                        for (int k = 0; k < maxk; k++)
                        {
                            float val = sptr[ space_ofs[k] ];
                            float w = kptr[k];
                            sum += val * w;
                        }

                        kptr += maxk;
                    }

                    outptr[j] = sum;
                }

                outptr += outw;
            }
        }
    }

    return 0;
}